

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O3

QName * __thiscall
Assimp::CFIReaderImpl::parseQualifiedNameOrIndex3
          (CFIReaderImpl *this,
          vector<Assimp::CFIReaderImpl::QName,_std::allocator<Assimp::CFIReaderImpl::QName>_>
          *qNameTable)

{
  byte bVar1;
  pointer pcVar2;
  pointer pQVar3;
  size_t sVar4;
  string *psVar5;
  DeadlyImportError *this_00;
  QName *pQVar6;
  QName result;
  undefined1 *local_b0;
  undefined8 local_a8;
  undefined1 local_a0 [16];
  undefined1 local_90 [32];
  _Alloc_hider local_70;
  size_type local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  _Alloc_hider local_50;
  size_type local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  bVar1 = *this->dataP;
  if ((~bVar1 & 0x3c) == 0) {
    this->dataP = this->dataP + 1;
    local_90._0_8_ = local_90 + 0x10;
    local_90._8_8_ = 0;
    local_90[0x10] = '\0';
    local_68 = 0;
    local_60._M_local_buf[0] = '\0';
    local_48 = 0;
    local_40._M_local_buf[0] = '\0';
    local_70._M_p = (pointer)&local_60;
    local_50._M_p = (pointer)&local_40;
    if ((bVar1 & 2) == 0) {
      local_b0 = local_a0;
      local_a8 = 0;
      local_a0[0] = 0;
    }
    else {
      psVar5 = parseIdentifyingStringOrIndex(this,&(this->vocabulary).prefixTable);
      local_b0 = local_a0;
      pcVar2 = (psVar5->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b0,pcVar2,pcVar2 + psVar5->_M_string_length);
    }
    std::__cxx11::string::_M_assign((string *)local_90);
    if (local_b0 != local_a0) {
      operator_delete(local_b0);
    }
    if ((bVar1 & 1) == 0) {
      local_a8 = 0;
      local_a0[0] = 0;
      local_b0 = local_a0;
    }
    else {
      psVar5 = parseIdentifyingStringOrIndex(this,&(this->vocabulary).namespaceNameTable);
      pcVar2 = (psVar5->_M_dataplus)._M_p;
      local_b0 = local_a0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b0,pcVar2,pcVar2 + psVar5->_M_string_length);
    }
    std::__cxx11::string::_M_assign((string *)&local_70);
    if (local_b0 != local_a0) {
      operator_delete(local_b0);
    }
    parseIdentifyingStringOrIndex(this,&(this->vocabulary).localNameTable);
    std::__cxx11::string::_M_assign((string *)&local_50);
    std::vector<Assimp::CFIReaderImpl::QName,_std::allocator<Assimp::CFIReaderImpl::QName>_>::
    push_back(qNameTable,(value_type *)local_90);
    pQVar3 = (qNameTable->
             super__Vector_base<Assimp::CFIReaderImpl::QName,_std::allocator<Assimp::CFIReaderImpl::QName>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_p != &local_40) {
      operator_delete(local_50._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_p != &local_60) {
      operator_delete(local_70._M_p);
    }
    if ((undefined1 *)local_90._0_8_ != local_90 + 0x10) {
      operator_delete((void *)local_90._0_8_);
    }
    pQVar6 = pQVar3 + -1;
  }
  else {
    sVar4 = parseInt3(this);
    pQVar3 = (qNameTable->
             super__Vector_base<Assimp::CFIReaderImpl::QName,_std::allocator<Assimp::CFIReaderImpl::QName>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(qNameTable->
                       super__Vector_base<Assimp::CFIReaderImpl::QName,_std::allocator<Assimp::CFIReaderImpl::QName>_>
                       )._M_impl.super__Vector_impl_data._M_finish - (long)pQVar3 >> 5) *
               -0x5555555555555555) <= sVar4) {
      this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      DeadlyImportError::DeadlyImportError(this_00,(string *)&parseErrorMessage_abi_cxx11_);
      __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    pQVar6 = pQVar3 + sVar4;
  }
  return pQVar6;
}

Assistant:

const QName &parseQualifiedNameOrIndex3(std::vector<QName> &qNameTable) { // C.18
        uint8_t b = *dataP;
        if ((b & 0x3c) == 0x3c) { // xx1111..
            // We have a literal (C.18.3)
            ++dataP;
            QName result;
            // prefix (C.18.3.1)
            result.prefix = b & 0x02 ? parseIdentifyingStringOrIndex(vocabulary.prefixTable) : std::string();
            // namespace-name (C.18.3.1)
            result.uri = b & 0x01 ? parseIdentifyingStringOrIndex(vocabulary.namespaceNameTable) : std::string();
            // local-name
            result.name = parseIdentifyingStringOrIndex(vocabulary.localNameTable);
            qNameTable.push_back(result);
            return qNameTable.back();
        }
        else {
            // We have an index (C.18.4)
            size_t index = parseInt3();
            if (index >= qNameTable.size()) {
                throw DeadlyImportError(parseErrorMessage);
            }
            return qNameTable[index];
        }
    }